

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::EndDeadLifetimes(LinearScan *this,Instr *instr,bool isLoopBackEdge)

{
  NodeBase **this_00;
  RegNum RVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  Type *ppLVar8;
  StackSlot *pSVar9;
  Type pLVar10;
  ulong uVar11;
  undefined1 local_80 [8];
  EditingIterator iter;
  EditingIterator stackPackIter;
  
  bVar4 = SkipNumberedInstr(this,instr);
  if (bVar4) {
    return;
  }
  local_80 = (undefined1  [8])this->activeLiveranges;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_80;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while (bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                           ((EditingIterator *)local_80), bVar4) {
    ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_80);
    uVar2 = (*ppLVar8)->end;
    uVar6 = IR::Instr::GetNumber(instr);
    if (uVar6 < uVar2) break;
    if ((!isLoopBackEdge) ||
       (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                           ((*ppLVar8)->sym->super_Sym).m_id), BVar5 == '\0')) {
      SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar8)->defList);
      SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar8)->useList);
      RVar1 = (*ppLVar8)->reg;
      uVar11 = (ulong)RVar1;
      BVUnitT<unsigned_long>::Clear(&this->activeRegs,(uint)RVar1);
      this->regContent[uVar11] = (Lifetime *)0x0;
      BVUnitT<unsigned_long>::Clear(&this->secondChanceRegs,(uint)RVar1);
      if (uVar11 - 1 < 0x10) {
        this->intRegUsedCount = this->intRegUsedCount - 1;
      }
      else {
        if (0xf < uVar11 - 0x11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x958,"(RegTypes[reg] == TyFloat64)","RegTypes[reg] == TyFloat64");
          if (!bVar4) goto LAB_0052f209;
          *puVar7 = 0;
        }
        this->floatRegUsedCount = this->floatRegUsedCount - 1;
      }
      SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
                ((EditingIterator *)local_80);
    }
  }
  iter.super_EditingIterator.last = (NodeBase *)this->stackPackInUseLiveRanges;
  this_00 = &iter.super_EditingIterator.last;
  do {
    do {
      bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)this_00);
      if (!bVar4) {
        return;
      }
      ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)this_00);
      uVar2 = (*ppLVar8)->end;
      uVar6 = IR::Instr::GetNumber(instr);
      if (uVar6 < uVar2) {
        return;
      }
    } while ((isLoopBackEdge) &&
            (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                               ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                                ((*ppLVar8)->sym->super_Sym).m_id), BVar5 != '\0'));
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar8)->defList);
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar8)->useList);
    pLVar10 = *ppLVar8;
    if ((pLVar10->field_0x9d & 0x10) == 0) {
      pSVar9 = pLVar10->spillStackSlot;
      if (pSVar9 == (StackSlot *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x971,"(deadStackPack->spillStackSlot)","deadStackPack->spillStackSlot")
        ;
        if (!bVar4) {
LAB_0052f209:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
        pLVar10 = *ppLVar8;
        pSVar9 = pLVar10->spillStackSlot;
      }
      pSVar9->lastUse = pLVar10->end;
      SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                (this->stackSlotsFreeList,&pLVar10->spillStackSlot);
    }
    SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
              ((EditingIterator *)this_00);
  } while( true );
}

Assistant:

void
LinearScan::EndDeadLifetimes(IR::Instr *instr, bool isLoopBackEdge)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    // Retire all active lifetime ending at this instruction
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadLifetime, this->activeLiveranges, iter)
    {
        if (deadLifetime->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadLifetime->sym->m_id))
        {
            continue;
        }
        deadLifetime->defList.Clear();
        deadLifetime->useList.Clear();

        RegNum reg = deadLifetime->reg;
        this->activeRegs.Clear(reg);
        this->regContent[reg] = nullptr;
        this->secondChanceRegs.Clear(reg);
        if (RegTypes[reg] == TyMachReg)
        {
            this->intRegUsedCount--;
        }
        else
        {
            Assert(RegTypes[reg] == TyFloat64);
            this->floatRegUsedCount--;
        }
        iter.RemoveCurrent();

    } NEXT_SLIST_ENTRY_EDITING;

    // Look for spilled lifetimes which end here such that we can make their stack slot
    // available for stack-packing.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadStackPack, this->stackPackInUseLiveRanges, stackPackIter)
    {
        if (deadStackPack->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadStackPack->sym->m_id))
        {
            continue;
        }
        deadStackPack->defList.Clear();
        deadStackPack->useList.Clear();

        if (!deadStackPack->cantStackPack)
        {
            Assert(deadStackPack->spillStackSlot);
            deadStackPack->spillStackSlot->lastUse = deadStackPack->end;
            this->stackSlotsFreeList->Push(deadStackPack->spillStackSlot);
        }
        stackPackIter.RemoveCurrent();
    } NEXT_SLIST_ENTRY_EDITING;

}